

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

void Pdr_ManVerifyInvariant(Pdr_Man_t *p)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *__ptr;
  sat_solver *s;
  Vec_Int_t *pVVar6;
  long lVar7;
  Pdr_Man_t *pPVar8;
  sat_solver *psVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  timespec ts;
  long local_50;
  timespec local_48;
  void **local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    local_50 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_50 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  iVar3 = Pdr_ManFindInvariantStart(p);
  __ptr = Pdr_ManCollectCubes(p,iVar3);
  iVar3 = p->vSolvers->nSize;
  pPVar8 = p;
  s = Pdr_ManCreateSolver(p,iVar3);
  iVar4 = (int)pPVar8;
  uVar1 = __ptr->nSize;
  uVar10 = (ulong)(int)uVar1;
  if (0 < (long)uVar10) {
    ppvVar2 = __ptr->pArray;
    uVar12 = 0;
    do {
      pVVar6 = Pdr_ManCubeToLits(p,iVar3,(Pdr_Set_t *)ppvVar2[uVar12],1,0);
      iVar4 = sat_solver_addclause(s,pVVar6->pArray,pVVar6->pArray + pVVar6->nSize);
      if (iVar4 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrInv.c"
                      ,0x1fd,"void Pdr_ManVerifyInvariant(Pdr_Man_t *)");
      }
      psVar9 = s;
      sat_solver_compress(s);
      iVar4 = (int)psVar9;
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  if ((int)uVar1 < 1) {
    uVar11 = 0;
  }
  else {
    local_38 = __ptr->pArray;
    uVar12 = 0;
    uVar11 = 0;
    do {
      pVVar6 = Pdr_ManCubeToLits(p,iVar3,(Pdr_Set_t *)local_38[uVar12],0,1);
      psVar9 = s;
      iVar5 = sat_solver_solve(s,pVVar6->pArray,pVVar6->pArray + pVVar6->nSize,0,0,0,0);
      iVar4 = (int)psVar9;
      if (iVar5 != -1) {
        Abc_Print(iVar4,"Verification of clause %d failed.\n",uVar12 & 0xffffffff);
        uVar11 = uVar11 + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  if (uVar11 == 0) {
    Abc_Print(iVar4,"Verification of invariant with %d clauses was successful.  ",(ulong)uVar1);
    iVar4 = 3;
    iVar3 = clock_gettime(3,&local_48);
    if (iVar3 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%s =","Time");
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar7 + local_50) / 1000000.0);
  }
  else {
    Abc_Print(iVar4,"Verification of %d clauses has failed.\n",(ulong)uVar11);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Pdr_ManVerifyInvariant( Pdr_Man_t * p )
{
    sat_solver * pSat;
    Vec_Int_t * vLits;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, kStart, kThis, RetValue, Counter = 0;
    abctime clk = Abc_Clock();
    // collect cubes used in the inductive invariant
    kStart = Pdr_ManFindInvariantStart( p );
    vCubes = Pdr_ManCollectCubes( p, kStart );
    // create solver with the cubes
    kThis = Vec_PtrSize(p->vSolvers);
    pSat  = Pdr_ManCreateSolver( p, kThis );
    // add the property output
//    Pdr_ManSetPropertyOutput( p, kThis );
    // add the clauses
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        vLits = Pdr_ManCubeToLits( p, kThis, pCube, 1, 0 );
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
        assert( RetValue );
        sat_solver_compress( pSat );
    }
    // check each clause
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        vLits = Pdr_ManCubeToLits( p, kThis, pCube, 0, 1 );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
        if ( RetValue != l_False )
        {
            Abc_Print( 1, "Verification of clause %d failed.\n", i );
            Counter++;
        }
    }
    if ( Counter )
        Abc_Print( 1, "Verification of %d clauses has failed.\n", Counter );
    else
    {
        Abc_Print( 1, "Verification of invariant with %d clauses was successful.  ", Vec_PtrSize(vCubes) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
//    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
}